

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  float *pfVar4;
  uint uVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [32];
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  
  uVar1 = a->c;
  uVar5 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pfVar4 = (float *)(a->cstep * uVar3 * a->elemsize + (long)a->data);
        pfVar6 = (float *)(b->cstep * uVar3 * b->elemsize + (long)b->data);
        pauVar7 = (undefined1 (*) [32])(c->cstep * uVar3 * c->elemsize + (long)c->data);
        if ((int)uVar5 < 8) {
          uVar9 = 0;
        }
        else {
          iVar8 = 7;
          do {
            auVar2._4_4_ = pfVar6[1] * pfVar4[1];
            auVar2._0_4_ = *pfVar6 * *pfVar4;
            auVar2._8_4_ = pfVar6[2] * pfVar4[2];
            auVar2._12_4_ = pfVar6[3] * pfVar4[3];
            auVar2._16_4_ = pfVar6[4] * pfVar4[4];
            auVar2._20_4_ = pfVar6[5] * pfVar4[5];
            auVar2._24_4_ = pfVar6[6] * pfVar4[6];
            auVar2._28_4_ = pfVar6[7];
            *pauVar7 = auVar2;
            pfVar4 = pfVar4 + 8;
            pfVar6 = pfVar6 + 8;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 8;
            uVar9 = uVar5 & 0xfffffff8;
          } while (iVar8 < (int)uVar5);
        }
        uVar11 = uVar9 | 3;
        while ((int)uVar11 < (int)uVar5) {
          auVar12._0_4_ = *pfVar6 * *pfVar4;
          auVar12._4_4_ = pfVar6[1] * pfVar4[1];
          auVar12._8_4_ = pfVar6[2] * pfVar4[2];
          auVar12._12_4_ = pfVar6[3] * pfVar4[3];
          *(undefined1 (*) [16])*pauVar7 = auVar12;
          pfVar4 = pfVar4 + 4;
          pfVar6 = pfVar6 + 4;
          pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
          uVar11 = uVar9 + 7;
          uVar9 = uVar9 + 4;
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)(*pauVar7 + lVar10 * 4) = pfVar6[lVar10] * pfVar4[lVar10];
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar1);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}